

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ida_ls.c
# Opt level: O1

int IDAGetJacCj(void *ida_mem,sunrealtype *cj_J)

{
  int iVar1;
  IDAMem IDA_mem;
  IDALsMem idals_mem;
  IDAMem local_18;
  IDALsMem local_10;
  
  iVar1 = idaLs_AccessLMem(ida_mem,"IDAGetJacCj",&local_18,&local_10);
  if (iVar1 == 0) {
    *cj_J = local_18->ida_cjold;
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int IDAGetJacCj(void* ida_mem, sunrealtype* cj_J)
{
  IDAMem IDA_mem;
  IDALsMem idals_mem;
  int retval;

  /* access IDALsMem structure; set output and return */
  retval = idaLs_AccessLMem(ida_mem, __func__, &IDA_mem, &idals_mem);
  if (retval != IDALS_SUCCESS) { return retval; }
  *cj_J = IDA_mem->ida_cjold;
  return IDALS_SUCCESS;
}